

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_5,_0,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Vector<float,_3> local_74;
  Matrix<float,_2,_2> local_68;
  Matrix<float,_2,_2> local_58;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  VecAccess<float,_4,_3> local_38;
  
  tcu::Matrix<float,_2,_2>::Matrix(&local_58,(Matrix<float,_2,_2> *)s_constInMat2);
  tcu::Matrix<float,_2,_2>::Matrix(&local_68,(Matrix<float,_2,_2> *)(s_constInMat2 + 0x10));
  tcu::operator*((tcu *)&local_48,&local_58,&local_68);
  local_74.m_data[2] = local_44 + local_3c;
  local_74.m_data[0] = local_48;
  local_74.m_data[1] = local_40;
  local_38.m_vector = &evalCtx->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,&local_74);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}